

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O2

void __thiscall
DDoor::DDoor(DDoor *this,sector_t *sec,EVlDoor type,double speed,int delay,int lightTag,
            int topcountdown)

{
  double *pdVar1;
  bool bVar2;
  DSectorEffect *pDVar3;
  double dVar4;
  vertex_t *spot;
  double local_38;
  
  local_38 = speed;
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,sec,true);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_007cafb0;
  this->m_Type = type;
  this->m_Speed = local_38;
  this->m_TopWait = delay;
  this->m_TopCountdown = topcountdown;
  this->m_LightTag = lightTag;
  if ((i_compatflags._1_1_ & 2) != 0) {
    this->m_LightTag = 0;
  }
  switch(type) {
  case doorClose:
    this->m_Direction = -1;
    dVar4 = sector_t::FindLowestCeilingSurrounding(sec,&spot);
    dVar4 = secplane_t::PointToDist(&sec->ceilingplane,spot,dVar4 + -4.0);
    this->m_TopDist = dVar4;
    break;
  case doorOpen:
  case doorRaise:
    this->m_Direction = 1;
    dVar4 = sector_t::FindLowestCeilingSurrounding(sec,&spot);
    dVar4 = secplane_t::PointToDist(&sec->ceilingplane,spot,dVar4 + -4.0);
    this->m_TopDist = dVar4;
    bVar2 = true;
    pdVar1 = &(sec->ceilingplane).D;
    if ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1))) goto switchD_0048fa0a_default;
    goto LAB_0048fb1a;
  case doorWaitRaise:
    this->m_Direction = 2;
    dVar4 = sector_t::FindLowestCeilingSurrounding(sec,&spot);
    dVar4 = secplane_t::PointToDist(&sec->ceilingplane,spot,dVar4 + -4.0);
    goto LAB_0048faff;
  case doorCloseWaitOpen:
    this->m_TopDist = (sec->ceilingplane).D;
    this->m_Direction = -1;
    break;
  case doorWaitClose:
    this->m_Direction = 0;
    this->m_Type = doorRaise;
    dVar4 = sector_t::FindHighestFloorPoint(sec,&this->m_BotSpot);
    dVar4 = secplane_t::PointToDist(&sec->ceilingplane,this->m_BotSpot,dVar4);
    this->m_BotDist = dVar4;
    this->m_OldFloorDist = (sec->floorplane).D;
    dVar4 = (sec->ceilingplane).D;
LAB_0048faff:
    this->m_TopDist = dVar4;
  default:
    goto switchD_0048fa0a_default;
  }
  bVar2 = false;
LAB_0048fb1a:
  DoorSound(this,bVar2,(DSeqNode *)0x0);
switchD_0048fa0a_default:
  pDVar3 = GC::ReadBarrier<DSectorEffect>
                     ((DSectorEffect **)
                      &((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                       floordata);
  if (pDVar3 != (DSectorEffect *)0x0) {
    pDVar3 = GC::ReadBarrier<DSectorEffect>
                       ((DSectorEffect **)
                        &((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                         floordata);
    bVar2 = DObject::IsKindOf((DObject *)pDVar3,DPlat::RegistrationInfo.MyClass);
    if ((bVar2) &&
       (pDVar3 = GC::ReadBarrier<DSectorEffect>
                           ((DSectorEffect **)
                            &((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector
                             )->floordata), *(int *)&pDVar3[1].m_Sector - 1U < 2)) {
      dVar4 = sector_t::FindLowestCeilingPoint(sec,&this->m_BotSpot);
      goto LAB_0048fb98;
    }
  }
  dVar4 = sector_t::FindHighestFloorPoint(sec,&this->m_BotSpot);
LAB_0048fb98:
  dVar4 = secplane_t::PointToDist(&sec->ceilingplane,this->m_BotSpot,dVar4);
  this->m_BotDist = dVar4;
  this->m_OldFloorDist = (sec->floorplane).D;
  return;
}

Assistant:

DDoor::DDoor (sector_t *sec, EVlDoor type, double speed, int delay, int lightTag, int topcountdown)
	: DMovingCeiling (sec),
  	  m_Type (type), m_Speed (speed), m_TopWait (delay), m_TopCountdown(topcountdown), m_LightTag (lightTag)
{
	vertex_t *spot;
	double height;

	if (i_compatflags & COMPATF_NODOORLIGHT)
	{
		m_LightTag = 0;
	}

	switch (type)
	{
	case doorClose:
		m_Direction = -1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		DoorSound (false);
		break;

	case doorOpen:
	case doorRaise:
		m_Direction = 1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		if (m_TopDist != sec->ceilingplane.fD())
			DoorSound (true);
		break;

	case doorCloseWaitOpen:
		m_TopDist = sec->ceilingplane.fD();
		m_Direction = -1;
		DoorSound (false);
		break;

	case doorWaitRaise:
		m_Direction = 2;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		break;

	case doorWaitClose:
		m_Direction = 0;
		m_Type = DDoor::doorRaise;
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
		m_OldFloorDist = sec->floorplane.fD();
		m_TopDist = sec->ceilingplane.fD();
		break;

	}

	if (!m_Sector->floordata || !m_Sector->floordata->IsKindOf(RUNTIME_CLASS(DPlat)) ||
		!(barrier_cast<DPlat*>(m_Sector->floordata))->IsLift())
	{
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	else
	{
		height = sec->FindLowestCeilingPoint(&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	m_OldFloorDist = sec->floorplane.fD();
}